

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

bool Js::JavascriptArray::CopyNativeFloatArrayElements
               (JavascriptNativeFloatArray *dstArray,uint32 dstIndex,
               JavascriptNativeFloatArray *srcArray,uint32 start,uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  uint32 count;
  int iVar7;
  double newValue;
  undefined1 local_50 [8];
  ArrayElementEnumerator e;
  
  uVar6 = (srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length;
  if (uVar6 < end) {
    end = uVar6;
  }
  if (start < end) {
    e.end = dstIndex;
    if (CARRY4(end - start,dstIndex)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2d2b,"(end - start <= MaxArrayLength - dstIndex)",
                                  "end - start <= MaxArrayLength - dstIndex");
      if (!bVar2) {
LAB_00b73142:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      if ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length <
          end) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2d2c,"(start < end && end <= srcArray->length)",
                                    "start < end && end <= srcArray->length");
        if (!bVar2) goto LAB_00b73142;
        *puVar4 = 0;
      }
    }
    ArrayElementEnumerator::ArrayElementEnumerator
              ((ArrayElementEnumerator *)local_50,(JavascriptArray *)srcArray,start,end);
    if (local_50 == (undefined1  [8])0x0) {
      count = 0;
    }
    else {
      iVar7 = e.end - start;
      count = 0;
LAB_00b73060:
      uVar5 = (ulong)(uint)e.seg;
      while( true ) {
        uVar6 = (int)uVar5 + 1;
        if (uVar6 < e.seg._4_4_) {
          uVar6 = e.seg._4_4_;
        }
        while (uVar6 - 1 != (int)uVar5) {
          e.seg._0_4_ = (int)uVar5 + 1;
          uVar5 = (ulong)(uint)e.seg;
          if (*(undefined1 **)
               (&((SparseArraySegmentBase *)((long)local_50 + 0x18))->left + uVar5 * 2) !=
              &DAT_fff80002fff80002) {
            uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_50);
            newValue = ArrayElementEnumerator::GetItem<double>((ArrayElementEnumerator *)local_50);
            DirectSetItemAt<double>((JavascriptArray *)dstArray,uVar3 + iVar7,newValue);
            count = count + 1;
            if (local_50 == (undefined1  [8])0x0) goto LAB_00b730f9;
            goto LAB_00b73060;
          }
        }
        local_50 = (undefined1  [8])((Type *)((long)local_50 + 0x10))->ptr;
        e.seg._0_4_ = uVar6;
        if (local_50 == (undefined1  [8])0x0) goto LAB_00b730f9;
        uVar6 = e.endIndex - ((SparseArraySegmentBase *)local_50)->left;
        if (e.endIndex < ((SparseArraySegmentBase *)local_50)->left || uVar6 == 0) break;
        e.seg._4_4_ = ((SparseArraySegmentBase *)local_50)->length;
        if (uVar6 < ((SparseArraySegmentBase *)local_50)->length) {
          e.seg._4_4_ = uVar6;
        }
        uVar5 = 0xffffffff;
      }
      local_50 = (undefined1  [8])0x0;
    }
LAB_00b730f9:
    bVar2 = count + start != end;
    if (bVar2) {
      JavascriptNativeFloatArray::ToVarArray(dstArray);
      InternalFillFromPrototype
                ((JavascriptArray *)dstArray,e.end,(JavascriptArray *)srcArray,start,end,count);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool JavascriptArray::CopyNativeFloatArrayElements(JavascriptNativeFloatArray* dstArray, uint32 dstIndex, JavascriptNativeFloatArray* srcArray, uint32 start, uint32 end)
    {
        end = min(end, srcArray->length);
        if (start >= end)
        {
            return false;
        }

        Assert(end - start <= MaxArrayLength - dstIndex);
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<double>())
        {
            uint n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<double>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            JavascriptArray *varArray = JavascriptNativeFloatArray::ToVarArray(dstArray);
            InternalFillFromPrototype(varArray, dstIndex, srcArray, start, end, count);
            return true;
        }

        return false;
    }